

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StdLib.cpp
# Opt level: O0

NULLCRef *
NULLC::AutoArrayAssignRev(NULLCRef *__return_storage_ptr__,NULLCRef left,NULLCAutoArray *right)

{
  void *__src;
  int iVar1;
  uint uVar2;
  uint uVar3;
  char *pcVar4;
  char *pcVar5;
  NULLCArray *arr;
  uint leftLength;
  NULLCRef ret;
  NULLCAutoArray *right_local;
  
  ret.ptr = (char *)right;
  memset((void *)((long)&arr + 4),0,0xc);
  if (ret.ptr == (char *)0x0) {
    nullcThrowError("ERROR: null pointer access");
    *(undefined8 *)__return_storage_ptr__ = stack0xffffffffffffffe4;
    *(uint *)((long)&__return_storage_ptr__->ptr + 4) = ret.typeID;
  }
  else if (left.typeID == 0xf) {
    *(undefined8 *)left.ptr = *(undefined8 *)ret.ptr;
    *(undefined8 *)(left.ptr + 8) = *(undefined8 *)(ret.ptr + 8);
    *(undefined8 *)__return_storage_ptr__ = stack0xffffffffffffffe4;
    *(uint *)((long)&__return_storage_ptr__->ptr + 4) = ret.typeID;
  }
  else {
    iVar1 = nullcIsArray(left.typeID);
    if (iVar1 == 0) {
      pcVar4 = nullcGetTypeName(left.typeID);
      nullcThrowError("ERROR: cannot convert from \'auto[]\' to \'%s\'",pcVar4);
      *(undefined8 *)__return_storage_ptr__ = stack0xffffffffffffffe4;
      *(uint *)((long)&__return_storage_ptr__->ptr + 4) = ret.typeID;
    }
    else {
      uVar2 = nullcGetSubType(left.typeID);
      if (uVar2 == *(uint *)ret.ptr) {
        uVar2 = nullcGetArraySize(left.typeID);
        if (uVar2 == 0xffffffff) {
          *(undefined4 *)(left.ptr + 8) = *(undefined4 *)(ret.ptr + 0xc);
          *(undefined8 *)left.ptr = *(undefined8 *)(ret.ptr + 4);
        }
        else {
          arr._0_4_ = uVar2;
          if (uVar2 != *(uint *)(ret.ptr + 0xc)) {
            pcVar4 = nullcGetTypeName(*(uint *)ret.ptr);
            uVar2 = *(uint *)(ret.ptr + 0xc);
            pcVar5 = nullcGetTypeName(left.typeID);
            nullcThrowError("ERROR: cannot convert from \'auto[]\' (actual type \'%s[%d]\') to \'%s\'"
                            ,pcVar4,(ulong)uVar2,pcVar5);
            *(undefined8 *)__return_storage_ptr__ = stack0xffffffffffffffe4;
            *(uint *)((long)&__return_storage_ptr__->ptr + 4) = ret.typeID;
            return __return_storage_ptr__;
          }
          __src = *(void **)(ret.ptr + 4);
          uVar3 = nullcGetTypeSize(*(uint *)ret.ptr);
          memcpy(left.ptr,__src,(ulong)(uVar2 * uVar3));
        }
        *(undefined8 *)__return_storage_ptr__ = left._0_8_;
        *(undefined4 *)((long)&__return_storage_ptr__->ptr + 4) = left.ptr._4_4_;
      }
      else {
        pcVar4 = nullcGetTypeName(*(uint *)ret.ptr);
        uVar2 = *(uint *)(ret.ptr + 0xc);
        pcVar5 = nullcGetTypeName(left.typeID);
        nullcThrowError("ERROR: cannot convert from \'auto[]\' (actual type \'%s[%d]\') to \'%s\'",
                        pcVar4,(ulong)uVar2,pcVar5);
        *(undefined8 *)__return_storage_ptr__ = stack0xffffffffffffffe4;
        *(uint *)((long)&__return_storage_ptr__->ptr + 4) = ret.typeID;
      }
    }
  }
  return __return_storage_ptr__;
}

Assistant:

NULLCRef NULLC::AutoArrayAssignRev(NULLCRef left, NULLCAutoArray *right)
{
	NULLCRef ret = { 0, 0 };

	if(!right)
	{
		nullcThrowError("ERROR: null pointer access");
		return ret;
	}
	if(left.typeID == NULLC_TYPE_AUTO_ARRAY)
	{
		*(NULLCAutoArray*)left.ptr = *right;
		return ret;
	}
	if(!nullcIsArray(left.typeID))
	{
		nullcThrowError("ERROR: cannot convert from 'auto[]' to '%s'", nullcGetTypeName(left.typeID));
		return ret;
	}
	if(nullcGetSubType(left.typeID) != right->typeID)
	{
		nullcThrowError("ERROR: cannot convert from 'auto[]' (actual type '%s[%d]') to '%s'", nullcGetTypeName(right->typeID), right->len, nullcGetTypeName(left.typeID));
		return ret;
	}

	unsigned int leftLength = nullcGetArraySize(left.typeID);

	if(leftLength == ~0u)
	{
		NULLCArray *arr = (NULLCArray*)left.ptr;
		arr->len = right->len;
		arr->ptr = right->ptr;
	}else{
		if(leftLength != right->len)
		{
			nullcThrowError("ERROR: cannot convert from 'auto[]' (actual type '%s[%d]') to '%s'", nullcGetTypeName(right->typeID), right->len, nullcGetTypeName(left.typeID));
			return ret;
		}
		memcpy(left.ptr, right->ptr, unsigned(leftLength * nullcGetTypeSize(right->typeID)));
	}

	return left;
}